

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O0

void xmlCtxtDumpNode(xmlDebugCtxtPtr ctxt,xmlNodePtr node)

{
  xmlNodePtr node_local;
  xmlDebugCtxtPtr ctxt_local;
  
  if (node == (xmlNodePtr)0x0) {
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
      fprintf((FILE *)ctxt->output,"node is NULL\n");
    }
  }
  else {
    xmlCtxtDumpOneNode(ctxt,node);
    if (((node->type != XML_NAMESPACE_DECL) && (node->children != (_xmlNode *)0x0)) &&
       (node->type != XML_ENTITY_REF_NODE)) {
      ctxt->depth = ctxt->depth + 1;
      xmlCtxtDumpNodeList(ctxt,node->children);
      ctxt->depth = ctxt->depth + -1;
    }
  }
  return;
}

Assistant:

static void
xmlCtxtDumpNode(xmlDebugCtxtPtr ctxt, xmlNodePtr node)
{
    if (node == NULL) {
        if (!ctxt->check) {
            xmlCtxtDumpSpaces(ctxt);
            fprintf(ctxt->output, "node is NULL\n");
        }
        return;
    }
    xmlCtxtDumpOneNode(ctxt, node);
    if ((node->type != XML_NAMESPACE_DECL) &&
        (node->children != NULL) && (node->type != XML_ENTITY_REF_NODE)) {
        ctxt->depth++;
        xmlCtxtDumpNodeList(ctxt, node->children);
        ctxt->depth--;
    }
}